

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O0

void bltchar(LispPTR *args)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint h_00;
  int w_00;
  uint uVar5;
  uint uVar6;
  LispPTR *pLVar7;
  LispPTR *pLVar8;
  DLword *pDVar9;
  DLword *ybase;
  DLword *pDVar10;
  sbyte sVar11;
  long lVar13;
  bool bVar14;
  uint local_148;
  uint local_144;
  uint local_104;
  uint local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  uint local_e8;
  int srcRshift;
  uint newS;
  uint savedS;
  uint shS;
  uint *src32addr;
  uint *dst32addr;
  uint sdw_mask;
  uint postloop_mask;
  uint preloop_mask;
  int bb_fast;
  uint *OrigDstAddr;
  uint *OrigSrcAddr;
  int fwd;
  int src32rbit;
  int dst32rbit;
  int abc;
  UNSIGNED x32ia;
  UNSIGNED x32nbyt;
  UNSIGNED x32byta;
  uint mask;
  uint dstdata;
  uint dstold;
  uint srcRmask;
  int dst32lbit;
  int srcLshift;
  int src32lbit;
  int dstnumL;
  int num_lines_remaining;
  int gray;
  DLword *dstbase;
  DLword *srcbase;
  int op;
  int src_comp;
  int dstbpl;
  int srcbpl;
  int dx;
  int sx;
  int backwardflg;
  int h;
  int w;
  int base;
  DISPLAYDATA *dspdata;
  PILOTBBT *pbt;
  LispPTR *args_local;
  sbyte sVar12;
  
  pLVar7 = NativeAligned4FromLAddr((uint)*(undefined8 *)args & 0xfffffff);
  pLVar8 = NativeAligned4FromLAddr((uint)((ulong)*(undefined8 *)args >> 0x20) & 0xfffffff);
  pDVar9 = NativeAligned2FromLAddr(CONCAT22((short)pLVar7[2],*(undefined2 *)((long)pLVar7 + 10)));
  ybase = NativeAligned2FromLAddr(CONCAT22((short)*pLVar7,*(undefined2 *)((long)pLVar7 + 2)));
  uVar3 = (uint)(short)pLVar7[3];
  if ((int)uVar3 < 1) {
    uVar3 = -uVar3;
  }
  uVar4 = (uint)(short)pLVar7[1];
  if ((int)uVar4 < 1) {
    uVar4 = -uVar4;
  }
  h_00 = (uint)(ushort)pLVar7[4];
  w_00 = ((uint)((ulong)*(undefined8 *)(args + 4) >> 0x20) & 0xffff) -
         ((uint)*(undefined8 *)(args + 4) & 0xffff);
  if ((h_00 != 0) && (0 < w_00)) {
    pDVar10 = NativeAligned2FromLAddr(pLVar8[9] + ((uint)*(undefined8 *)(args + 2) & 0xffff));
    uVar5 = ((uint)*(ushort *)((ulong)pDVar10 ^ 2) + ((uint)*(undefined8 *)(args + 4) & 0xffff)) -
            ((uint)((ulong)*(undefined8 *)(args + 2) >> 0x20) & 0xffff);
    uVar6 = (uint)*(undefined8 *)(args + 4) & 0xffff;
    uVar1 = *(ushort *)((long)pLVar7 + 0x16) >> 9 & 3;
    uVar2 = *(ushort *)((long)pLVar7 + 0x16) >> 0xb & 1;
    ScreenLocked = 1;
    srcRshift = 0;
    if ((int)uVar6 < 0) {
      lVar13 = -(long)((int)(7 - uVar6) >> 3);
    }
    else {
      lVar13 = (long)((int)uVar6 >> 3);
    }
    x32nbyt = (long)ybase + lVar13;
    _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
    dstold = (int)((x32nbyt & 3) << 3) + ((uint)*(undefined8 *)(args + 4) & 7);
    fwd = (dstold + w_00) - 1 & 0x1f;
    if (dstold == 0) {
      local_100 = 0xffffffff;
    }
    else {
      local_100 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
    }
    dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
    dst32addr._0_4_ = local_100 & dst32addr._4_4_;
    srcLshift = ((int)(dstold + w_00) >> 5) + -1;
    if ((int)uVar5 < 0) {
      lVar13 = -(long)((int)(7 - uVar5) >> 3);
    }
    else {
      lVar13 = (long)((int)uVar5 >> 3);
    }
    x32nbyt = (long)pDVar9 + lVar13;
    OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
    dst32lbit = (int)((x32nbyt & 3) << 3) + (uVar5 & 7);
    OrigSrcAddr._4_4_ = (dst32lbit + w_00) - 1U & 0x1f;
    srcRmask = dst32lbit - dstold & 0x1f;
    if (srcRmask == 0) {
      local_104 = 0xffffffff;
    }
    else {
      local_104 = -1 << (sbyte)srcRmask ^ 0xffffffff;
    }
    local_e8 = dstold - dst32lbit & 0x1f;
    dstdata = local_104;
    sdw_mask = local_100;
    bVar14 = ((uVar3 | uVar4) & 0x1f) != 0;
    src32lbit = h_00;
    while( true ) {
      src32addr = _preloop_mask;
      if (src32lbit < 1) break;
      sVar11 = (sbyte)local_e8;
      sVar12 = (sbyte)srcRmask;
      if ((dstold < (uint)dst32lbit) && (0x20 < dst32lbit + w_00)) {
        _savedS = OrigDstAddr + 2;
        newS = *OrigDstAddr << sVar12 | OrigDstAddr[1] >> sVar11 & dstdata;
        srcRshift = OrigDstAddr[1] << sVar12 & (dstdata ^ 0xffffffff);
      }
      else {
        if (dstold < (uint)dst32lbit) {
          newS = *OrigDstAddr << sVar12;
        }
        else {
          newS = *OrigDstAddr >> sVar11 & dstdata;
          srcRshift = *OrigDstAddr << sVar12 & (dstdata ^ 0xffffffff);
        }
        _savedS = OrigDstAddr + 1;
      }
      if (uVar2 != 0) {
        newS = newS ^ 0xffffffff;
      }
      if ((int)(dstold + w_00) < 0x21) {
        x32byta._0_4_ = (uint)dst32addr;
LAB_00117999:
        x32byta._4_4_ = *src32addr;
        uVar5 = x32byta._4_4_ & ~(uint)x32byta;
        switch(uVar1) {
        case 0:
          x32byta._4_4_ = newS;
          break;
        case 1:
          x32byta._4_4_ = newS & x32byta._4_4_;
          break;
        case 2:
          x32byta._4_4_ = newS | x32byta._4_4_;
          break;
        case 3:
          x32byta._4_4_ = newS ^ x32byta._4_4_;
        }
        *src32addr = uVar5 | (uint)x32byta & x32byta._4_4_;
      }
      else {
        x32byta._4_4_ = *_preloop_mask;
        uVar5 = x32byta._4_4_ & ~sdw_mask;
        switch(uVar1) {
        case 0:
          x32byta._4_4_ = newS;
          break;
        case 1:
          x32byta._4_4_ = newS & x32byta._4_4_;
          break;
        case 2:
          x32byta._4_4_ = newS | x32byta._4_4_;
          break;
        case 3:
          x32byta._4_4_ = newS ^ x32byta._4_4_;
        }
        *_preloop_mask = uVar5 | sdw_mask & x32byta._4_4_;
        src32addr = _preloop_mask + 1;
        if (dst32lbit == dstold) {
          if (uVar2 == 0) {
            switch(uVar1) {
            case 0:
              local_f0 = srcLshift;
              while (local_f0 = local_f0 + -1, -1 < local_f0) {
                *src32addr = *_savedS;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 1:
              local_f0 = srcLshift;
              while (local_f0 = local_f0 + -1, -1 < local_f0) {
                *src32addr = *_savedS & *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 2:
              local_f0 = srcLshift;
              while (local_f0 = local_f0 + -1, -1 < local_f0) {
                *src32addr = *_savedS | *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 3:
              local_f0 = srcLshift;
              while (local_f0 = local_f0 + -1, -1 < local_f0) {
                *src32addr = *_savedS ^ *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
            }
          }
          else {
            switch(uVar1) {
            case 0:
              local_ec = srcLshift;
              while (local_ec = local_ec + -1, -1 < local_ec) {
                *src32addr = *_savedS ^ 0xffffffff;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 1:
              local_ec = srcLshift;
              while (local_ec = local_ec + -1, -1 < local_ec) {
                *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 2:
              local_ec = srcLshift;
              while (local_ec = local_ec + -1, -1 < local_ec) {
                *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 3:
              local_ec = srcLshift;
              while (local_ec = local_ec + -1, -1 < local_ec) {
                *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
            }
          }
        }
        else if (uVar2 == 0) {
          switch(uVar1) {
          case 0:
            local_f8 = srcLshift;
            while (local_f8 = local_f8 + -1, -1 < local_f8) {
              uVar5 = srcRshift | *_savedS >> sVar11;
              srcRshift = *_savedS << sVar12;
              *src32addr = uVar5;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_f8 = srcLshift;
            while (local_f8 = local_f8 + -1, -1 < local_f8) {
              uVar5 = srcRshift | *_savedS >> sVar11;
              srcRshift = *_savedS << sVar12;
              *src32addr = uVar5 & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_f8 = srcLshift;
            while (local_f8 = local_f8 + -1, -1 < local_f8) {
              uVar5 = srcRshift | *_savedS >> sVar11;
              srcRshift = *_savedS << sVar12;
              *src32addr = uVar5 | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_f8 = srcLshift;
            while (local_f8 = local_f8 + -1, -1 < local_f8) {
              uVar5 = srcRshift | *_savedS >> sVar11;
              srcRshift = *_savedS << sVar12;
              *src32addr = uVar5 ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        else {
          switch(uVar1) {
          case 0:
            local_f4 = srcLshift;
            while (local_f4 = local_f4 + -1, -1 < local_f4) {
              uVar5 = srcRshift | *_savedS >> sVar11;
              srcRshift = *_savedS << sVar12;
              *src32addr = uVar5 ^ 0xffffffff;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_f4 = srcLshift;
            while (local_f4 = local_f4 + -1, -1 < local_f4) {
              uVar5 = srcRshift | *_savedS >> sVar11;
              srcRshift = *_savedS << sVar12;
              *src32addr = (uVar5 ^ 0xffffffff) & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_f4 = srcLshift;
            while (local_f4 = local_f4 + -1, -1 < local_f4) {
              uVar5 = srcRshift | *_savedS >> sVar11;
              srcRshift = *_savedS << sVar12;
              *src32addr = uVar5 ^ 0xffffffff | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_f4 = srcLshift;
            while (local_f4 = local_f4 + -1, -1 < local_f4) {
              uVar5 = srcRshift | *_savedS >> sVar11;
              srcRshift = *_savedS << sVar12;
              *src32addr = uVar5 ^ 0xffffffff ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        if (fwd != 0x1f) {
          if ((uint)fwd < OrigSrcAddr._4_4_) {
            newS = srcRshift;
          }
          else {
            newS = srcRshift | *_savedS >> sVar11 & dstdata;
          }
          if (uVar2 != 0) {
            newS = newS ^ 0xffffffff;
          }
          x32byta._0_4_ = dst32addr._4_4_;
          goto LAB_00117999;
        }
      }
      uVar5 = uVar4;
      if (bVar14) {
        uVar5 = uVar4 + dstold;
        dstold = uVar5 & 0x1f;
        fwd = (dstold + w_00) - 1 & 0x1f;
        if (dstold == 0) {
          local_144 = 0xffffffff;
        }
        else {
          local_144 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        sdw_mask = local_144;
        dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
        dst32addr._0_4_ = local_144 & dst32addr._4_4_;
        srcLshift = ((int)(dstold + w_00) >> 5) + -1;
      }
      _preloop_mask = _preloop_mask + ((int)uVar5 >> 5);
      uVar5 = uVar3;
      if (bVar14) {
        uVar5 = uVar3 + dst32lbit;
        dst32lbit = uVar5 & 0x1f;
        OrigSrcAddr._4_4_ = (dst32lbit + w_00) - 1U & 0x1f;
        local_e8 = dstold - dst32lbit & 0x1f;
        srcRmask = dst32lbit - dstold & 0x1f;
        if (srcRmask == 0) {
          local_148 = 0xffffffff;
        }
        else {
          local_148 = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_148;
      }
      OrigDstAddr = OrigDstAddr + ((int)uVar5 >> 5);
      src32lbit = src32lbit + -1;
    }
    if ((DisplayRegion68k <= ybase) && (ybase <= DISP_MAX_Address)) {
      flush_display_lineregion((long)(int)uVar6,ybase,w_00,h_00);
    }
    ScreenLocked = 0;
  }
  return;
}

Assistant:

void bltchar(LispPTR *args)
/*      args[0] :       PILOTBBT
 *      args[1] :       DISPLAYDATA
 *      args[2] :       CHAR8CODE
 *      args[3] :       CURX
 *      args[4] :       LEFT
 *      args[5] :       RIGHT
 */
{
  PILOTBBT *pbt;
  DISPLAYDATA *dspdata;
  int base;
#ifdef REALCURSOR
  int displayflg;
#endif
  int w, h;
  int backwardflg = 0, sx, dx, srcbpl, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0;
#ifdef NEWBITBLT
  int num_gray = 0, curr_gray_line = 0;
#endif

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(((BLTC *)args)->pilotbbt);
  dspdata = (DISPLAYDATA *)NativeAligned4FromLAddr(((BLTC *)args)->displaydata);

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));

  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  srcbpl = abs(pbt->pbtsourcebpl);
  dstbpl = abs(pbt->pbtdestbpl);
  h = pbt->pbtheight;
  w = ((BLTC *)args)->right - ((BLTC *)args)->left;
  if ((h <= 0) || (w <= 0)) return;

  base = GETWORD(NativeAligned2FromLAddr(dspdata->ddoffsetscache + ((BLTC *)args)->char8code));
  sx = base + ((BLTC *)args)->left - ((BLTC *)args)->curx;
  dx = ((BLTC *)args)->left;

#ifdef REALCURSOR
  /* if displayflg != 0 then source or destination is DisplayBitMap
   * Now we consider about only destination
   */
  displayflg = cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (((BLTC *)args)->left >> 4)),
                        (((BLTC *)args)->right - ((BLTC *)args)->left), pbt->pbtheight, pbt->pbtbackward);
#endif /* REALCURSOR */

  op = pbt->pbtoperation;
  src_comp = pbt->pbtsourcetype;

  LOCKSCREEN;

#ifdef REALCURSOR
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_char_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    if (in_display_segment(dstbase)) { flush_display_lineregion(dx, dstbase, w, h); }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* SDL */

#ifdef DOS
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;
}